

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  Session session;
  
  Catch::Session::Session(&session);
  iVar1 = Catch::Session::applyCommandLine(&session,argc,argv,Fail);
  if (iVar1 == 0) {
    iVar1 = Catch::Session::run(&session);
  }
  Catch::Session::~Session(&session);
  return iVar1;
}

Assistant:

int main(int argc, char const * const argv[]) {
    Catch::Session session; // There must be exactly once instance

    // writing to session.configData() here sets defaults
    // this is the preferred way to set them

    int returnCode = session.applyCommandLine( argc, argv );
    if( returnCode != 0 ) // Indicates a command line error
        return returnCode;

    // writing to session.configData() or session.Config() here
    // overrides command line args
    // only do this if you know you need to

    return session.run();
}